

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O3

void __thiscall
cxxopts::invalid_option_format_error::invalid_option_format_error
          (invalid_option_format_error *this,string *format)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::operator+(&local_38,"Invalid option format ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (anonymous_namespace)::LQUOTE_abi_cxx11_);
  pbVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_38,(format->_M_dataplus)._M_p,format->_M_string_length);
  local_78._M_dataplus._M_p = (pbVar1->_M_dataplus)._M_p;
  paVar2 = &pbVar1->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p == paVar2) {
    local_78.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
    local_78.field_2._8_8_ = *(undefined8 *)((long)&pbVar1->field_2 + 8);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  }
  else {
    local_78.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  local_78._M_string_length = pbVar1->_M_string_length;
  (pbVar1->_M_dataplus)._M_p = (pointer)paVar2;
  pbVar1->_M_string_length = 0;
  (pbVar1->field_2)._M_local_buf[0] = '\0';
  pbVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_78,(anonymous_namespace)::RQUOTE_abi_cxx11_,DAT_001306e8);
  local_58._M_dataplus._M_p = (pbVar1->_M_dataplus)._M_p;
  paVar2 = &pbVar1->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p == paVar2) {
    local_58.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
    local_58.field_2._8_8_ = *(undefined8 *)((long)&pbVar1->field_2 + 8);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  }
  else {
    local_58.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  local_58._M_string_length = pbVar1->_M_string_length;
  (pbVar1->_M_dataplus)._M_p = (pointer)paVar2;
  pbVar1->_M_string_length = 0;
  (pbVar1->field_2)._M_local_buf[0] = '\0';
  OptionSpecException::OptionSpecException(&this->super_OptionSpecException,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)&(this->super_OptionSpecException).super_OptionException =
       &PTR__OptionException_0012f530;
  return;
}

Assistant:

explicit invalid_option_format_error(const std::string& format)
    : OptionSpecException("Invalid option format " + LQUOTE + format + RQUOTE)
    {
    }